

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O1

void absl::lts_20250127::time_internal::cctz::time_zone::Impl::ClearTimeZoneMapTestOnly(void)

{
  iterator *piVar1;
  _Elt_pointer ppIVar2;
  deque<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
  *pdVar3;
  int iVar4;
  pthread_mutex_t *__mutex;
  _Deque_base<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
  *this;
  _Hash_node_base *p_Var5;
  
  __mutex = (pthread_mutex_t *)anon_unknown_7::TimeZoneMutex();
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 == 0) {
    if (cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_ ==
        (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) goto LAB_00397d3e;
    if (ClearTimeZoneMapTestOnly()::cleared == '\0') goto LAB_00397d52;
  }
  else {
    std::__throw_system_error(iVar4);
LAB_00397d52:
    iVar4 = __cxa_guard_acquire(&ClearTimeZoneMapTestOnly()::cleared);
    if (iVar4 != 0) {
      this = (_Deque_base<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
              *)operator_new(0x50);
      (this->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      (this->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      (this->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      (this->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      (this->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      (this->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      (this->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      (this->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      (this->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      (this->_M_impl).super__Deque_impl_data._M_map_size = 0;
      std::
      _Deque_base<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
      ::_M_initialize_map(this,0);
      ClearTimeZoneMapTestOnly::cleared =
           (deque<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
            *)this;
      __cxa_guard_release(&ClearTimeZoneMapTestOnly()::cleared);
    }
  }
  for (p_Var5 = (cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_before_begin)._M_nxt;
      pdVar3 = ClearTimeZoneMapTestOnly::cleared, p_Var5 != (_Hash_node_base *)0x0;
      p_Var5 = p_Var5->_M_nxt) {
    ppIVar2 = (ClearTimeZoneMapTestOnly::cleared->
              super__Deque_base<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
              )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppIVar2 ==
        (ClearTimeZoneMapTestOnly::cleared->
        super__Deque_base<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
        )._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<absl::lts_20250127::time_internal::cctz::time_zone::Impl_const*,std::allocator<absl::lts_20250127::time_internal::cctz::time_zone::Impl_const*>>
      ::_M_push_back_aux<absl::lts_20250127::time_internal::cctz::time_zone::Impl_const*const&>
                ((deque<absl::lts_20250127::time_internal::cctz::time_zone::Impl_const*,std::allocator<absl::lts_20250127::time_internal::cctz::time_zone::Impl_const*>>
                  *)ClearTimeZoneMapTestOnly::cleared,(Impl **)(p_Var5 + 5));
    }
    else {
      *ppIVar2 = (Impl *)p_Var5[5]._M_nxt;
      piVar1 = &(pdVar3->
                super__Deque_base<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>
                )._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_);
LAB_00397d3e:
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void time_zone::Impl::ClearTimeZoneMapTestOnly() {
  std::lock_guard<std::mutex> lock(TimeZoneMutex());
  if (time_zone_map != nullptr) {
    // Existing time_zone::Impl* entries are in the wild, so we can't delete
    // them. Instead, we move them to a private container, where they are
    // logically unreachable but not "leaked".  Future requests will result
    // in reloading the data.
    static auto* cleared = new std::deque<const time_zone::Impl*>;
    for (const auto& element : *time_zone_map) {
      cleared->push_back(element.second);
    }
    time_zone_map->clear();
  }
}